

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall Memory::Recycler::ScanImplicitRoots(Recycler *this)

{
  Recycler *this_local;
  
  if ((this->enableScanImplicitRoots & 1U) != 0) {
    if ((this->hasScannedInitialImplicitRoots & 1U) == 0) {
      ScanInitialImplicitRoots(this);
      this->hasScannedInitialImplicitRoots = true;
    }
    else {
      ScanNewImplicitRoots(this);
    }
  }
  return;
}

Assistant:

void
Recycler::ScanImplicitRoots()
{
    if (this->enableScanImplicitRoots)
    {
        RECYCLER_PROFILE_EXEC_BEGIN(this, Js::FindImplicitRootPhase);
        if (!this->hasScannedInitialImplicitRoots)
        {
            this->ScanInitialImplicitRoots();
            this->hasScannedInitialImplicitRoots = true;
        }
        else
        {
            this->ScanNewImplicitRoots();
        }
        RECYCLER_PROFILE_EXEC_END(this, Js::FindImplicitRootPhase);
    }
}